

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggerTest.cpp
# Opt level: O0

int main(void)

{
  LogLevel LVar1;
  Logger *pLVar2;
  Fmt local_1930;
  Logger local_1830;
  Fmt local_1618;
  Logger local_1518;
  Fmt local_1300;
  Logger local_1200;
  Fmt local_fe8;
  Logger local_ee8;
  allocator<char> local_cc9;
  string local_cc8;
  allocator<char> local_ca1;
  string local_ca0;
  Fmt local_c80;
  Logger local_b80;
  Fmt local_968;
  Logger local_868;
  Fmt local_650;
  Logger local_550;
  Fmt local_328;
  Logger local_228;
  undefined4 local_c;
  
  local_c = 0;
  higan::Logger::SetLogLevel(DEBUG);
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              (&local_228,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xb,"main");
    higan::Fmt::Fmt(&local_328,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<(&local_228,&local_328);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_228);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              (&local_550,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xc,"main");
    higan::Fmt::Fmt(&local_650,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<(&local_550,&local_650);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_550);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              (&local_868,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xd,"main");
    higan::Fmt::Fmt(&local_968,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<(&local_868,&local_968);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_868);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              (&local_b80,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0xe,"main");
    higan::Fmt::Fmt(&local_c80,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<(&local_b80,&local_c80);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_b80);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ca0,"/root/log/test",&local_ca1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_cc8,"test",&local_cc9);
  higan::Logger::SetLogToFile(&local_ca0,&local_cc8,false);
  std::__cxx11::string::~string((string *)&local_cc8);
  std::allocator<char>::~allocator(&local_cc9);
  std::__cxx11::string::~string((string *)&local_ca0);
  std::allocator<char>::~allocator(&local_ca1);
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 1) {
    higan::Logger::Logger
              (&local_ee8,DEBUG,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x12,"main");
    higan::Fmt::Fmt(&local_fe8,"%s: %s","DEBUG");
    pLVar2 = higan::Logger::operator<<(&local_ee8,&local_fe8);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_ee8);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 2) {
    higan::Logger::Logger
              (&local_1200,INFO,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x13,"main");
    higan::Fmt::Fmt(&local_1300,"%s: %s","INFO");
    pLVar2 = higan::Logger::operator<<(&local_1200,&local_1300);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_1200);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 3) {
    higan::Logger::Logger
              (&local_1518,WARN,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x14,"main");
    higan::Fmt::Fmt(&local_1618,"%s: %s","WARN");
    pLVar2 = higan::Logger::operator<<(&local_1518,&local_1618);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_1518);
  }
  LVar1 = higan::Logger::GetLogLevel();
  if ((int)LVar1 < 4) {
    higan::Logger::Logger
              (&local_1830,ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/base/test/LoggerTest.cpp"
               ,0x15,"main");
    higan::Fmt::Fmt(&local_1930,"%s: %s","ERROR");
    pLVar2 = higan::Logger::operator<<(&local_1830,&local_1930);
    higan::Logger::operator<<(pLVar2," 1");
    higan::Logger::~Logger(&local_1830);
  }
  return 0;
}

Assistant:

int main()
{
	higan::Logger::SetLogLevel(higan::Logger::DEBUG);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	higan::Logger::SetLogToFile("/root/log/test", "test", false);

	LOG_DEBUG << higan::Fmt("%s: %s", "DEBUG", "DEBUG") << " 1";
	LOG_INFO << higan::Fmt("%s: %s", "INFO", "INFO") << " 1";
	LOG_WARN << higan::Fmt("%s: %s", "WARN", "WARN") << " 1";
	LOG_ERROR << higan::Fmt("%s: %s", "ERROR", "ERROR") << " 1";

	return 0;
}